

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

bool tchecker::zg::shared_is_alu_le(state_t *s1,state_t *s2,map_t *l,map_t *u)

{
  zone_t *this;
  zone_t *zone;
  bool bVar1;
  bool bVar2;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
  local_40;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
  local_38;
  
  bVar1 = ta::shared_equal_to(&s1->super_state_t,&s2->super_state_t);
  if (bVar1) {
    local_38._t = (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0;
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::reset(&local_38,(s1->_zone)._t);
    local_40._t = (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0;
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::reset(&local_40,(s2->_zone)._t);
    if (local_38._t == local_40._t) {
      bVar2 = true;
    }
    else {
      this = &((s1->_zone)._t)->super_zone_t;
      if ((this == (zone_t *)0x0) || (zone = &((s2->_zone)._t)->super_zone_t, zone == (zone_t *)0x0)
         ) {
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1d0,
                      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::zg::zone_t>]"
                     );
      }
      bVar2 = zone_t::is_alu_le(this,zone,l,u);
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar1) {
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_40);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_38);
  }
  return bVar2;
}

Assistant:

bool shared_is_alu_le(tchecker::zg::state_t const & s1, tchecker::zg::state_t const & s2,
                      tchecker::clockbounds::map_t const & l, tchecker::clockbounds::map_t const & u)
{
  return tchecker::ta::shared_equal_to(s1, s2) && (s1.zone_ptr() == s2.zone_ptr() || s1.zone().is_alu_le(s2.zone(), l, u));
}